

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

WFile * open_existing_wfile(char *name,uint64_t *size)

{
  int iVar1;
  WFile *pWVar2;
  char *pcVar3;
  stat statbuf;
  stat local_b0;
  
  pWVar2 = (WFile *)0x0;
  iVar1 = open(name,0x401);
  if (-1 < iVar1) {
    pWVar2 = (WFile *)safemalloc(1,0x10,0);
    pWVar2->fd = iVar1;
    pcVar3 = dupstr(name);
    pWVar2->name = pcVar3;
    if (size != (uint64_t *)0x0) {
      iVar1 = fstat(iVar1,&local_b0);
      if (iVar1 < 0) {
        open_existing_wfile_cold_1();
        local_b0.st_size = 0;
      }
      *size = local_b0.st_size;
    }
  }
  return pWVar2;
}

Assistant:

WFile *open_existing_wfile(const char *name, uint64_t *size)
{
    int fd;
    WFile *ret;

    fd = open(name, O_APPEND | O_WRONLY);
    if (fd < 0)
        return NULL;

    ret = snew(WFile);
    ret->fd = fd;
    ret->name = dupstr(name);

    if (size) {
        struct stat statbuf;
        if (fstat(fd, &statbuf) < 0) {
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
            memset(&statbuf, 0, sizeof(statbuf));
        }

        *size = statbuf.st_size;
    }

    return ret;
}